

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interleaved_sudoku.cpp
# Opt level: O3

bool __thiscall
InterleavedSudoku::boxCheck
          (InterleavedSudoku *this,
          list<Sudoku::FurtherWays,_std::allocator<Sudoku::FurtherWays>_> *furtherWays_,
          vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_> *testFields,
          bool recordFullFurtherWays,bool debug)

{
  bool bVar1;
  bool bVar2;
  
  (this->super_Sudoku).current_z_ = 0;
  bVar1 = Sudoku::boxCheck(&this->super_Sudoku,furtherWays_,testFields,recordFullFurtherWays,debug);
  (this->super_Sudoku).current_z_ = 1;
  bVar2 = Sudoku::boxCheck(&this->super_Sudoku,furtherWays_,testFields,recordFullFurtherWays,debug);
  return bVar2 || bVar1;
}

Assistant:

bool InterleavedSudoku::boxCheck(std::list< Sudoku::FurtherWays >& furtherWays_, std::vector< std::shared_ptr< Field > >& testFields, bool recordFullFurtherWays, bool debug)
{
  current_z_ = 0;
  bool restart0 = Sudoku::boxCheck(furtherWays_, testFields, recordFullFurtherWays, debug);

  current_z_ = 1;
  bool restart1 = Sudoku::boxCheck(furtherWays_, testFields, recordFullFurtherWays, debug);

  return restart0 || restart1;
}